

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_traits.hpp
# Opt level: O1

void jsoncons::encode_traits<std::pair<int,int>,char,void>::
     encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (value_type *val,basic_json_visitor<char> *encoder,
               basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *proto,
               error_code *ec)

{
  undefined **local_28;
  
  local_28 = &PTR__ser_context_00b58eb8;
  (*encoder->_vptr_basic_json_visitor[7])(encoder,2,0,&local_28,ec);
  if (ec->_M_value == 0) {
    local_28 = &PTR__ser_context_00b58eb8;
    (*encoder->_vptr_basic_json_visitor[0x10])(encoder,(long)val->first,0,&local_28,ec);
    if (ec->_M_value == 0) {
      local_28 = &PTR__ser_context_00b58eb8;
      (*encoder->_vptr_basic_json_visitor[0x10])(encoder,(long)val->second,0,&local_28,ec);
      if (ec->_M_value == 0) {
        local_28 = &PTR__ser_context_00b58eb8;
        (*encoder->_vptr_basic_json_visitor[8])(encoder,&local_28,ec);
      }
    }
  }
  return;
}

Assistant:

static void encode(const value_type& val, 
                           basic_json_visitor<CharT>& encoder, 
                           const Json& proto, 
                           std::error_code& ec)
        {
            encoder.begin_array(2,semantic_tag::none,ser_context(),ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
            encode_traits<T1,CharT>::encode(val.first, encoder, proto, ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
            encode_traits<T2,CharT>::encode(val.second, encoder, proto, ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
            encoder.end_array(ser_context(),ec);
        }